

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_convolution_add(NetOptimize *this)

{
  float fVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  bool bVar4;
  reference ppLVar5;
  reference pvVar6;
  size_type sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  float *pfVar10;
  float *pfVar11;
  reference pvVar12;
  long in_RDI;
  int top_blob_index_final;
  int i_1;
  float *bias;
  Mat bias_data;
  bool broadcasting_type_ok;
  int channels;
  MemoryData *memorydata;
  size_t k;
  BinaryOp *binaryop;
  Convolution *convolution;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  char *in_stack_fffffffffffffef8;
  Mat *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  value_type in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff38;
  value_type in_stack_ffffffffffffff3c;
  value_type in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Mat local_98;
  char local_4d;
  int local_4c;
  value_type local_48;
  size_type local_40;
  value_type local_38;
  value_type local_30;
  size_type local_28;
  value_type local_1c;
  size_type local_18;
  ulong local_10;
  
  local_10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                       (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (local_10 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (!bVar4) {
      ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar5)->tops,0);
      local_1c = *pvVar6;
      local_28 = local_18;
      do {
        do {
          do {
            local_28 = local_28 + 1;
            if (local_10 <= local_28) goto LAB_00152fb8;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_28);
            bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          } while (bVar4);
          ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_28);
          sVar7 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar5)->bottoms);
        } while (sVar7 != 2);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar5)->bottoms,0);
      } while (*pvVar6 != local_1c);
LAB_00152fb8:
      if (local_28 != local_10) {
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_18);
        local_30 = *ppLVar5;
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        local_38 = *ppLVar5;
        if ((*(int *)&local_38[1]._vptr_Layer == 0) &&
           (*(int *)((long)&local_38[1]._vptr_Layer + 4) == 0)) {
          for (local_40 = 0; local_40 < local_28; local_40 = local_40 + 1) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_40);
            bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
            if (!bVar4) {
              ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),local_40);
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar5)->tops,0);
              in_stack_ffffffffffffff3c = *pvVar6;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_38->bottoms,1);
              if (in_stack_ffffffffffffff3c == *pvVar6) break;
            }
          }
          if (local_40 != local_28) {
            ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_40);
            __stream = _stderr;
            local_48 = *ppLVar5;
            local_4c = *(int *)&local_30[1]._vptr_Layer;
            local_4d = '\0';
            if (((*(int *)&local_48[1]._vptr_Layer == local_4c) &&
                (*(int *)((long)&local_48[1]._vptr_Layer + 4) == 0)) &&
               (iVar2._0_1_ = local_48[1].one_blob_only, iVar2._1_1_ = local_48[1].support_inplace,
               iVar2._2_1_ = local_48[1].support_vulkan, iVar2._3_1_ = local_48[1].support_packing,
               iVar2 == 0)) {
              local_4d = '\x01';
            }
            if (((*(int *)&local_48[1]._vptr_Layer == 1) &&
                (*(int *)((long)&local_48[1]._vptr_Layer + 4) == 1)) &&
               (iVar3._0_1_ = local_48[1].one_blob_only, iVar3._1_1_ = local_48[1].support_inplace,
               iVar3._2_1_ = local_48[1].support_vulkan, iVar3._3_1_ = local_48[1].support_packing,
               iVar3 == local_4c)) {
              local_4d = '\x01';
            }
            if (local_4d != '\0') {
              uVar8 = std::__cxx11::string::c_str();
              uVar9 = std::__cxx11::string::c_str();
              fprintf(__stream,"fuse_convolution_add %s %s\n",uVar8,uVar9);
              ncnn::Mat::reshape((Mat *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ),(int)((ulong)in_RDI >> 0x20),
                                 (Allocator *)
                                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
              if (*(int *)&local_30[1].type == 0) {
                *(undefined4 *)&local_30[1].type = 1;
                ncnn::Mat::operator=
                          ((Mat *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           in_stack_ffffffffffffff00);
              }
              else {
                pfVar10 = ncnn::Mat::operator_cast_to_float_((Mat *)&local_30[2].one_blob_only);
                for (in_stack_ffffffffffffff4c = 0; in_stack_ffffffffffffff4c < local_4c;
                    in_stack_ffffffffffffff4c = in_stack_ffffffffffffff4c + 1) {
                  fVar1 = pfVar10[in_stack_ffffffffffffff4c];
                  pfVar11 = ncnn::Mat::operator[](&local_98,(long)in_stack_ffffffffffffff4c);
                  pfVar10[in_stack_ffffffffffffff4c] = fVar1 + *pfVar11;
                }
              }
              in_stack_ffffffffffffff00 = (Mat *)0x0;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_38->tops,0);
              in_stack_ffffffffffffff0c = *pvVar6;
              in_stack_ffffffffffffff48 = in_stack_ffffffffffffff0c;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_30->tops,(size_type)in_stack_ffffffffffffff00);
              *pvVar6 = in_stack_ffffffffffffff0c;
              iVar2 = (int)local_18;
              pvVar12 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                  (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)
                                    (in_RDI + 0x50),(long)in_stack_ffffffffffffff48);
              pvVar12->producer = iVar2;
              std::__cxx11::string::operator=((string *)&local_38->type,"ncnnfused");
              ncnn::Mat::~Mat((Mat *)0x1533d9);
            }
          }
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_convolution_add()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution")
            continue;

        // Convolution - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Convolution - BinaryOp to Convolution
        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 0 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = convolution->num_output;

        bool broadcasting_type_ok = false;
        if (memorydata->w == channels && memorydata->h == 0 && memorydata->c == 0)
            broadcasting_type_ok = true;
        if (memorydata->w == 1 && memorydata->h == 1 && memorydata->c == channels)
            broadcasting_type_ok = true;

        if (!broadcasting_type_ok)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_convolution_add %s %s\n", convolution->name.c_str(), binaryop->name.c_str());

        ncnn::Mat bias_data = memorydata->data.reshape(channels);
        {
            if (convolution->bias_term == 0)
            {
                // init bias
                convolution->bias_term = 1;
                convolution->bias_data = bias_data;
            }
            else
            {
                float* bias = convolution->bias_data;
                for (int i = 0; i < channels; i++)
                {
                    bias[i] = bias[i] + bias_data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        convolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}